

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_b8a4c2::FilterRegex
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool includeMatches,string *listName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varArgsExpanded,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view separator;
  string_view value_00;
  string error;
  string value;
  RegularExpression regex;
  string local_150;
  string local_130;
  undefined8 local_110;
  char *local_108;
  RegularExpression local_100;
  
  local_100.regmust = (char *)0x0;
  local_100.program = (char *)0x0;
  local_100.progsize = 0;
  memset(&local_100,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_100,
             (char *)args[5].
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  pcVar3 = local_100.program;
  if (local_100.program == (char *)0x0) {
    local_130.field_2._8_8_ =
         args[5].
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_130.field_2._M_allocated_capacity =
         (size_type)
         args[5].
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_130._M_dataplus._M_p = (pointer)0x38;
    local_130._M_string_length = 0x6bd8d6;
    local_110 = 2;
    local_108 = "\".";
    views._M_len = 3;
    views._M_array = (iterator)&local_130;
    cmCatViews_abi_cxx11_(&local_150,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    _Var6._M_p = local_150._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p == &local_150.field_2) goto LAB_002b562c;
  }
  else {
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(varArgsExpanded->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(varArgsExpanded->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    lVar5 = (long)paVar2 - (long)paVar1;
    this = paVar1;
    if (0 < lVar5 >> 7) {
      lVar8 = (lVar5 >> 7) + 1;
      paVar7 = paVar1 + 4;
      do {
        this = paVar7;
        bVar4 = cmsys::RegularExpression::find
                          (&local_100,(char *)this[-4]._M_allocated_capacity,&local_100.regmatch);
        if (bVar4 != includeMatches) {
          this = this + -4;
          goto LAB_002b5584;
        }
        bVar4 = cmsys::RegularExpression::find
                          (&local_100,(char *)this[-2]._M_allocated_capacity,&local_100.regmatch);
        if (bVar4 != includeMatches) {
          this = this + -2;
          goto LAB_002b5584;
        }
        bVar4 = cmsys::RegularExpression::find
                          (&local_100,(char *)this->_M_allocated_capacity,&local_100.regmatch);
        if (bVar4 != includeMatches) goto LAB_002b5584;
        bVar4 = cmsys::RegularExpression::find
                          (&local_100,(char *)this[2]._M_allocated_capacity,&local_100.regmatch);
        if (bVar4 != includeMatches) {
          this = this + 2;
          goto LAB_002b5584;
        }
        lVar8 = lVar8 + -1;
        lVar5 = lVar5 + -0x80;
        paVar7 = this + 8;
      } while (1 < lVar8);
      this = this + 4;
    }
    lVar5 = lVar5 >> 5;
    if (lVar5 == 1) {
LAB_002b5556:
      bVar4 = cmsys::RegularExpression::find
                        (&local_100,(char *)this->_M_allocated_capacity,&local_100.regmatch);
      if (bVar4 == includeMatches) {
        this = paVar2;
      }
LAB_002b5584:
      paVar7 = this + 2;
      local_150._M_string_length = (size_type)this;
      if (paVar7 != paVar2 && this != paVar2) {
        do {
          bVar4 = cmsys::RegularExpression::find
                            (&local_100,(char *)paVar7->_M_allocated_capacity,&local_100.regmatch);
          if (bVar4 == includeMatches) {
            std::__cxx11::string::operator=
                      ((string *)this->_M_local_buf,(string *)paVar7->_M_local_buf);
            this = this + 2;
          }
          paVar7 = paVar7 + 2;
          local_150._M_string_length = (size_type)this;
        } while (paVar7 != paVar2);
      }
    }
    else {
      if (lVar5 == 2) {
LAB_002b553d:
        bVar4 = cmsys::RegularExpression::find
                          (&local_100,(char *)this->_M_allocated_capacity,&local_100.regmatch);
        if (bVar4 == includeMatches) {
          this = this + 2;
          goto LAB_002b5556;
        }
        goto LAB_002b5584;
      }
      local_150._M_string_length = (size_type)paVar2;
      if (lVar5 == 3) {
        bVar4 = cmsys::RegularExpression::find
                          (&local_100,(char *)this->_M_allocated_capacity,&local_100.regmatch);
        if (bVar4 == includeMatches) {
          this = this + 2;
          goto LAB_002b553d;
        }
        goto LAB_002b5584;
      }
    }
    separator._M_str = ";";
    separator._M_len = 1;
    local_150._M_dataplus._M_p = (pointer)paVar1;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_130,
               (cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&local_150,separator);
    value_00._M_str = local_130._M_dataplus._M_p;
    value_00._M_len = local_130._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,listName,value_00);
    local_150.field_2._M_allocated_capacity = local_130.field_2._M_allocated_capacity;
    _Var6._M_p = local_130._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_002b562c;
  }
  operator_delete(_Var6._M_p,
                  (ulong)((long)&(((pointer)local_150.field_2._M_allocated_capacity)->_M_dataplus).
                                 _M_p + 1));
LAB_002b562c:
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  return pcVar3 != (char *)0x0;
}

Assistant:

bool FilterRegex(std::vector<std::string> const& args, bool includeMatches,
                 std::string const& listName,
                 std::vector<std::string>& varArgsExpanded,
                 cmExecutionStatus& status)
{
  const std::string& pattern = args[4];
  cmsys::RegularExpression regex(pattern);
  if (!regex.is_valid()) {
    std::string error =
      cmStrCat("sub-command FILTER, mode REGEX failed to compile regex \"",
               pattern, "\".");
    status.SetError(error);
    return false;
  }

  auto argsBegin = varArgsExpanded.begin();
  auto argsEnd = varArgsExpanded.end();
  auto newArgsEnd =
    std::remove_if(argsBegin, argsEnd, MatchesRegex(regex, includeMatches));

  std::string value = cmJoin(cmMakeRange(argsBegin, newArgsEnd), ";");
  status.GetMakefile().AddDefinition(listName, value);
  return true;
}